

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DepthFirstSearch.h
# Opt level: O1

void __thiscall
netlist::
DepthFirstSearch<netlist::NetlistNode,_netlist::NetlistEdge,_netlist::PathFinder::Visitor,_netlist::PathFinder::EdgePredicate>
::DepthFirstSearch(DepthFirstSearch<netlist::NetlistNode,_netlist::NetlistEdge,_netlist::PathFinder::Visitor,_netlist::PathFinder::EdgePredicate>
                   *this,Visitor *visitor,NetlistNode *startNode)

{
  _Rb_tree_header *p_Var1;
  
  this->visitor = visitor;
  p_Var1 = &(this->visitedNodes)._M_t._M_impl.super__Rb_tree_header;
  (this->visitedNodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->visitedNodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->visitedNodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->visitedNodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->visitedNodes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->visitStack).
  super__Vector_base<std::pair<netlist::NetlistNode_&,___gnu_cxx::__normal_iterator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_*,_std::vector<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>_>_>,_std::allocator<std::pair<netlist::NetlistNode_&,___gnu_cxx::__normal_iterator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_*,_std::vector<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->visitStack).
  super__Vector_base<std::pair<netlist::NetlistNode_&,___gnu_cxx::__normal_iterator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_*,_std::vector<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>_>_>,_std::allocator<std::pair<netlist::NetlistNode_&,___gnu_cxx::__normal_iterator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_*,_std::vector<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->visitStack).
  super__Vector_base<std::pair<netlist::NetlistNode_&,___gnu_cxx::__normal_iterator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_*,_std::vector<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>_>_>,_std::allocator<std::pair<netlist::NetlistNode_&,___gnu_cxx::__normal_iterator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_*,_std::vector<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  setup(this,startNode);
  run(this);
  return;
}

Assistant:

DepthFirstSearch(Visitor& visitor, NodeType& startNode) : visitor(visitor) {
        setup(startNode);
        run();
    }